

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hint_source.cpp
# Opt level: O0

void __thiscall
HintSource::HintSource
          (HintSource *this,vector<unsigned_short,_std::allocator<unsigned_short>_> *text_ids,
          string *description,WorldNode *node,bool small_textbox,
          vector<unsigned_short,_std::allocator<unsigned_short>_> *map_ids,Position position,
          uint8_t orientation,bool high_palette)

{
  bool high_palette_local;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *map_ids_local;
  bool small_textbox_local;
  WorldNode *node_local;
  string *description_local;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *text_ids_local;
  HintSource *this_local;
  
  this->_vptr_HintSource = (_func_int **)&PTR_to_json_abi_cxx11__003c7510;
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector(&this->_text_ids,text_ids);
  std::__cxx11::string::string((string *)&this->_description,description);
  this->_node = node;
  this->_small_textbox = small_textbox;
  std::__cxx11::string::string((string *)&this->_text);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector(&this->_map_ids,map_ids);
  (this->_position).x = position.x;
  (this->_position).y = position.y;
  (this->_position).z = position.z;
  (this->_position).half_x = position.half_x;
  (this->_position).half_y = position.half_y;
  (this->_position).half_z = position.half_z;
  this->_orientation = orientation;
  this->_high_palette = high_palette;
  return;
}

Assistant:

HintSource::HintSource(std::vector<uint16_t> text_ids, std::string description,
        WorldNode* node, bool small_textbox,
        std::vector<uint16_t> map_ids, Position position, uint8_t orientation, bool high_palette) :
    _text_ids       (std::move(text_ids)),
    _description    (std::move(description)),
    _node           (node),
    _small_textbox  (small_textbox),
    _map_ids        (std::move(map_ids)),
    _position       (position),
    _orientation    (orientation),
    _high_palette   (high_palette)
{}